

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmEval.cpp
# Opt level: O0

bool __thiscall
InstructionVMEvalContext::Storage::Reserve
          (Storage *this,InstructionVMEvalContext *ctx,uint offset,uint size)

{
  uint index;
  uint uVar1;
  char *__s;
  uint newSize;
  uint oldSize;
  uint size_local;
  uint offset_local;
  InstructionVMEvalContext *ctx_local;
  Storage *this_local;
  
  index = SmallArray<char,_128U>::size(&this->data);
  uVar1 = offset + size;
  if (uVar1 < ctx->frameMemoryLimit) {
    if (index < uVar1) {
      SmallArray<char,_128U>::resize(&this->data,uVar1 + 0x20);
      __s = SmallArray<char,_128U>::operator[](&this->data,index);
      uVar1 = SmallArray<char,_128U>::size(&this->data);
      memset(__s,0,(ulong)(uVar1 - index));
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool InstructionVMEvalContext::Storage::Reserve(InstructionVMEvalContext &ctx, unsigned offset, unsigned size)
{
	unsigned oldSize = data.size();
	unsigned newSize = offset + size;

	if(newSize >= ctx.frameMemoryLimit)
		return false;

	if(newSize > oldSize)
	{
		data.resize(newSize + 32);

		memset(&data[oldSize], 0, data.size() - oldSize);
	}

	return true;
}